

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

string * __thiscall
slang::parsing::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  SyntaxPrinter *pSVar3;
  SyntaxPrinter local_40;
  
  paVar1 = &local_40.buffer.field_2;
  local_40.buffer.field_2._M_allocated_capacity = 0;
  local_40.buffer.field_2._8_8_ = 0;
  local_40.buffer._M_string_length = 0;
  local_40.sourceManager = (SourceManager *)0x0;
  local_40.includeTrivia = true;
  local_40.includeMissing = false;
  local_40.includeSkipped = false;
  local_40.includeDirectives = false;
  local_40.includePreprocessed = true;
  local_40.includeComments = true;
  local_40.squashNewlines = true;
  local_40._47_1_ = 0;
  local_40.buffer._M_dataplus._M_p = (pointer)paVar1;
  pSVar3 = slang::syntax::SyntaxPrinter::print(&local_40,*this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pSVar3->buffer)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pSVar3->buffer)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.buffer._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.buffer._M_dataplus._M_p,
                    local_40.buffer.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::toString() const {
    return SyntaxPrinter().print(*this).str();
}